

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O3

uint64_t __thiscall Rng::rnd64(Rng *this)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = cmwc4096()::i + 1 & 0xfff;
  uVar3 = (ulong)cmwc4096()::c_ + (ulong)this->Q_[uVar7] * 0x495e;
  uVar6 = (uint)(uVar3 >> 0x20);
  uVar2 = (int)uVar3 + uVar6;
  uVar5 = -(uVar2 + (uVar2 < uVar6)) - 2;
  this->Q_[uVar7] = uVar5;
  cmwc4096()::i = cmwc4096()::i + 2 & 0xfff;
  lVar4 = (ulong)this->Q_[cmwc4096()::i] * 0x495e + (uVar3 >> 0x20) + (ulong)(uVar2 < uVar6);
  uVar6 = (uint)((ulong)lVar4 >> 0x20);
  lVar4 = lVar4 + (ulong)uVar6;
  uVar2 = (uint)lVar4;
  cmwc4096()::c_ = (uint)((ulong)lVar4 >> 0x20);
  uVar1 = -(uVar2 + (uVar2 < uVar6)) - 2;
  this->Q_[cmwc4096()::i] = uVar1;
  return CONCAT44(uVar5,uVar1);
}

Assistant:

uint32_t cmwc4096() noexcept{
    uint64_t t, a=18782LL;
    static uint32_t i=4095,c_=362436;
    uint32_t x,r=0xfffffffe;
        i=(i+1)&4095;
        t=a*Q_[i]+c_;
        c_=(t>>32);
        x=t+c_;
        if(x<c_){
            x++;c_++;
        }
        return(Q_[i]=r-x);
    }